

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::Seek(BamToolsIndex *this,int64_t *position,int origin)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  allocator local_71;
  string local_70 [16];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  BamException *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [56];
  
  uVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x30))(*(long **)(in_RDI + 0x60),in_RSI,in_EDX);
  if ((uVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BamToolsIndex::Seek",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"could not seek in BAI file",&local_71);
    BamException::BamException
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamToolsIndex::Seek(const int64_t& position, const int origin)
{
    if (!m_resources.Device->Seek(position, origin))
        throw BamException("BamToolsIndex::Seek", "could not seek in BAI file");
}